

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.h
# Opt level: O1

void __thiscall
sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
          (RealValuedFastFourierTransform *this)

{
  pointer pdVar1;
  
  this->_vptr_RealValuedFastFourierTransform =
       (_func_int **)&PTR__RealValuedFastFourierTransform_00112c98;
  pdVar1 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  (this->fast_fourier_transform_)._vptr_FastFourierTransform =
       (_func_int **)&PTR__FastFourierTransform_00112cc8;
  pdVar1 = (this->fast_fourier_transform_).sine_table_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~RealValuedFastFourierTransform() {
  }